

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl.cpp
# Opt level: O2

bool ImGui_ImplGlfwGL3_CreateDeviceObjects(void)

{
  GLint last_vertex_array;
  GLint last_array_buffer;
  GLint last_texture;
  GLchar *fragment_shader_with_version [2];
  GLchar *vertex_shader_with_version [2];
  
  (*glad_glGetIntegerv)(0x8069,&last_texture);
  (*glad_glGetIntegerv)(0x8894,&last_array_buffer);
  (*glad_glGetIntegerv)(0x85b5,&last_vertex_array);
  vertex_shader_with_version[0] = g_GlslVersion;
  vertex_shader_with_version[1] =
       "uniform mat4 ProjMtx;\nin vec2 Position;\nin vec2 UV;\nin vec4 Color;\nout vec2 Frag_UV;\nout vec4 Frag_Color;\nvoid main()\n{\n\tFrag_UV = UV;\n\tFrag_Color = Color;\n\tgl_Position = ProjMtx * vec4(Position.xy,0,1);\n}\n"
  ;
  fragment_shader_with_version[0] = g_GlslVersion;
  fragment_shader_with_version[1] =
       "uniform sampler2D Texture;\nin vec2 Frag_UV;\nin vec4 Frag_Color;\nout vec4 Out_Color;\nvoid main()\n{\n\tOut_Color = Frag_Color * texture( Texture, Frag_UV.st);\n}\n"
  ;
  g_ShaderHandle = (*glad_glCreateProgram)();
  g_VertHandle = (*glad_glCreateShader)(0x8b31);
  g_FragHandle = (*glad_glCreateShader)(0x8b30);
  (*glad_glShaderSource)(g_VertHandle,2,vertex_shader_with_version,(GLint *)0x0);
  (*glad_glShaderSource)(g_FragHandle,2,fragment_shader_with_version,(GLint *)0x0);
  (*glad_glCompileShader)(g_VertHandle);
  (*glad_glCompileShader)(g_FragHandle);
  (*glad_glAttachShader)(g_ShaderHandle,g_VertHandle);
  (*glad_glAttachShader)(g_ShaderHandle,g_FragHandle);
  (*glad_glLinkProgram)(g_ShaderHandle);
  g_AttribLocationTex = (*glad_glGetUniformLocation)(g_ShaderHandle,"Texture");
  g_AttribLocationProjMtx = (*glad_glGetUniformLocation)(g_ShaderHandle,"ProjMtx");
  g_AttribLocationPosition = (*glad_glGetAttribLocation)(g_ShaderHandle,"Position");
  g_AttribLocationUV = (*glad_glGetAttribLocation)(g_ShaderHandle,"UV");
  g_AttribLocationColor = (*glad_glGetAttribLocation)(g_ShaderHandle,"Color");
  (*glad_glGenBuffers)(1,&g_VboHandle);
  (*glad_glGenBuffers)(1,&g_ElementsHandle);
  ImGui_ImplGlfwGL3_CreateFontsTexture();
  (*glad_glBindTexture)(0xde1,last_texture);
  (*glad_glBindBuffer)(0x8892,last_array_buffer);
  (*glad_glBindVertexArray)(last_vertex_array);
  return true;
}

Assistant:

bool ImGui_ImplGlfwGL3_CreateDeviceObjects()
{
    // Backup GL state
    GLint last_texture, last_array_buffer, last_vertex_array;
    glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
    glGetIntegerv(GL_ARRAY_BUFFER_BINDING, &last_array_buffer);
    glGetIntegerv(GL_VERTEX_ARRAY_BINDING, &last_vertex_array);

    const GLchar* vertex_shader =
        "uniform mat4 ProjMtx;\n"
        "in vec2 Position;\n"
        "in vec2 UV;\n"
        "in vec4 Color;\n"
        "out vec2 Frag_UV;\n"
        "out vec4 Frag_Color;\n"
        "void main()\n"
        "{\n"
        "	Frag_UV = UV;\n"
        "	Frag_Color = Color;\n"
        "	gl_Position = ProjMtx * vec4(Position.xy,0,1);\n"
        "}\n";

    const GLchar* fragment_shader =
        "uniform sampler2D Texture;\n"
        "in vec2 Frag_UV;\n"
        "in vec4 Frag_Color;\n"
        "out vec4 Out_Color;\n"
        "void main()\n"
        "{\n"
        "	Out_Color = Frag_Color * texture( Texture, Frag_UV.st);\n"
        "}\n";

    const GLchar* vertex_shader_with_version[2] = { g_GlslVersion, vertex_shader };
    const GLchar* fragment_shader_with_version[2] = { g_GlslVersion, fragment_shader };

    g_ShaderHandle = glCreateProgram();
    g_VertHandle = glCreateShader(GL_VERTEX_SHADER);
    g_FragHandle = glCreateShader(GL_FRAGMENT_SHADER);
    glShaderSource(g_VertHandle, 2, vertex_shader_with_version, NULL);
    glShaderSource(g_FragHandle, 2, fragment_shader_with_version, NULL);
    glCompileShader(g_VertHandle);
    glCompileShader(g_FragHandle);
    glAttachShader(g_ShaderHandle, g_VertHandle);
    glAttachShader(g_ShaderHandle, g_FragHandle);
    glLinkProgram(g_ShaderHandle);

    g_AttribLocationTex = glGetUniformLocation(g_ShaderHandle, "Texture");
    g_AttribLocationProjMtx = glGetUniformLocation(g_ShaderHandle, "ProjMtx");
    g_AttribLocationPosition = glGetAttribLocation(g_ShaderHandle, "Position");
    g_AttribLocationUV = glGetAttribLocation(g_ShaderHandle, "UV");
    g_AttribLocationColor = glGetAttribLocation(g_ShaderHandle, "Color");

    glGenBuffers(1, &g_VboHandle);
    glGenBuffers(1, &g_ElementsHandle);

    ImGui_ImplGlfwGL3_CreateFontsTexture();

    // Restore modified GL state
    glBindTexture(GL_TEXTURE_2D, last_texture);
    glBindBuffer(GL_ARRAY_BUFFER, last_array_buffer);
    glBindVertexArray(last_vertex_array);

    return true;
}